

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::XMLURL::conglomerateWithBase(XMLURL *this,XMLURL *baseURL,bool useExceptions)

{
  short *psVar1;
  Protocols PVar2;
  XMLCh *pXVar3;
  int iVar4;
  MalformedURLException *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  XMLCh *pXVar5;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  size_t sVar6;
  bool bVar7;
  
  PVar2 = baseURL->fProtocol;
  bVar7 = true;
  if ((PVar2 != Unknown) && (baseURL->fPath != (XMLCh *)0x0)) {
    bVar7 = *baseURL->fPath != L'/';
  }
  if (bVar7 == false) {
    if (this->fProtocol == Unknown) {
      if (((this->fHost == (XMLCh *)0x0) && (this->fPath == (XMLCh *)0x0)) &&
         (this->fFragment != (XMLCh *)0x0)) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUser);
        pXVar5 = (XMLCh *)0x0;
        this->fUser = (XMLCh *)0x0;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPassword);
        this->fPassword = (XMLCh *)0x0;
        this->fProtocol = baseURL->fProtocol;
        this->fPortNum = baseURL->fPortNum;
        pXVar3 = baseURL->fHost;
        if (pXVar3 != (XMLCh *)0x0) {
          sVar6 = 0;
          do {
            psVar1 = (short *)((long)pXVar3 + sVar6);
            sVar6 = sVar6 + 2;
          } while (*psVar1 != 0);
          iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
          pXVar5 = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
          memcpy(pXVar5,pXVar3,sVar6);
        }
        this->fHost = pXVar5;
        pXVar3 = baseURL->fUser;
        if (pXVar3 == (XMLCh *)0x0) {
          pXVar5 = (XMLCh *)0x0;
        }
        else {
          sVar6 = 0;
          do {
            psVar1 = (short *)((long)pXVar3 + sVar6);
            sVar6 = sVar6 + 2;
          } while (*psVar1 != 0);
          iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
          pXVar5 = (XMLCh *)CONCAT44(extraout_var_02,iVar4);
          memcpy(pXVar5,pXVar3,sVar6);
        }
        this->fUser = pXVar5;
        pXVar3 = baseURL->fPassword;
        if (pXVar3 == (XMLCh *)0x0) {
          pXVar5 = (XMLCh *)0x0;
        }
        else {
          sVar6 = 0;
          do {
            psVar1 = (short *)((long)pXVar3 + sVar6);
            sVar6 = sVar6 + 2;
          } while (*psVar1 != 0);
          iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
          pXVar5 = (XMLCh *)CONCAT44(extraout_var_03,iVar4);
          memcpy(pXVar5,pXVar3,sVar6);
        }
        this->fPassword = pXVar5;
        pXVar3 = baseURL->fPath;
        if (pXVar3 == (XMLCh *)0x0) {
          pXVar5 = (XMLCh *)0x0;
        }
        else {
          sVar6 = 0;
          do {
            psVar1 = (short *)((long)pXVar3 + sVar6);
            sVar6 = sVar6 + 2;
          } while (*psVar1 != 0);
          iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
          pXVar5 = (XMLCh *)CONCAT44(extraout_var_04,iVar4);
          memcpy(pXVar5,pXVar3,sVar6);
        }
        this->fPath = pXVar5;
      }
      else {
        this->fProtocol = PVar2;
        if ((PVar2 == File) || ((this->fHost == (XMLCh *)0x0 && (baseURL->fHost != (XMLCh *)0x0))))
        {
          if (baseURL->fHost != (XMLCh *)0x0) {
            (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUser);
            pXVar5 = (XMLCh *)0x0;
            this->fUser = (XMLCh *)0x0;
            (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPassword);
            this->fPassword = (XMLCh *)0x0;
            (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
            this->fHost = (XMLCh *)0x0;
            pXVar3 = baseURL->fHost;
            if (pXVar3 != (XMLCh *)0x0) {
              sVar6 = 0;
              do {
                psVar1 = (short *)((long)pXVar3 + sVar6);
                sVar6 = sVar6 + 2;
              } while (*psVar1 != 0);
              iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
              pXVar5 = (XMLCh *)CONCAT44(extraout_var,iVar4);
              memcpy(pXVar5,pXVar3,sVar6);
            }
            this->fHost = pXVar5;
            pXVar3 = baseURL->fUser;
            if (pXVar3 == (XMLCh *)0x0) {
              pXVar5 = (XMLCh *)0x0;
            }
            else {
              sVar6 = 0;
              do {
                psVar1 = (short *)((long)pXVar3 + sVar6);
                sVar6 = sVar6 + 2;
              } while (*psVar1 != 0);
              iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
              pXVar5 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
              memcpy(pXVar5,pXVar3,sVar6);
            }
            this->fUser = pXVar5;
            pXVar3 = baseURL->fPassword;
            if (pXVar3 == (XMLCh *)0x0) {
              pXVar5 = (XMLCh *)0x0;
            }
            else {
              sVar6 = 0;
              do {
                psVar1 = (short *)((long)pXVar3 + sVar6);
                sVar6 = sVar6 + 2;
              } while (*psVar1 != 0);
              iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
              pXVar5 = (XMLCh *)CONCAT44(extraout_var_05,iVar4);
              memcpy(pXVar5,pXVar3,sVar6);
            }
            this->fPassword = pXVar5;
            this->fPortNum = baseURL->fPortNum;
          }
          pXVar3 = this->fPath;
          if ((pXVar3 == (XMLCh *)0x0) || (*pXVar3 != L'/')) {
            if (baseURL->fPath != (XMLCh *)0x0) {
              pXVar5 = XMLPlatformUtils::weavePaths(baseURL->fPath,pXVar3,this->fMemoryManager);
              (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
              this->fPath = pXVar5;
            }
            if (((pXVar3 == (XMLCh *)0x0) && (this->fQuery == (XMLCh *)0x0)) &&
               (pXVar3 = baseURL->fQuery, pXVar3 != (XMLCh *)0x0)) {
              sVar6 = 0;
              do {
                psVar1 = (short *)((long)pXVar3 + sVar6);
                sVar6 = sVar6 + 2;
              } while (*psVar1 != 0);
              iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
              memcpy((XMLCh *)CONCAT44(extraout_var_06,iVar4),pXVar3,sVar6);
              this->fQuery = (XMLCh *)CONCAT44(extraout_var_06,iVar4);
              if ((this->fFragment == (XMLCh *)0x0) &&
                 (pXVar3 = baseURL->fFragment, pXVar3 != (XMLCh *)0x0)) {
                sVar6 = 0;
                do {
                  psVar1 = (short *)((long)pXVar3 + sVar6);
                  sVar6 = sVar6 + 2;
                } while (*psVar1 != 0);
                iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
                memcpy((XMLCh *)CONCAT44(extraout_var_07,iVar4),pXVar3,sVar6);
                this->fFragment = (XMLCh *)CONCAT44(extraout_var_07,iVar4);
              }
            }
          }
        }
      }
    }
  }
  else if (useExceptions) {
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x340,URL_RelativeBaseURL,this->fMemoryManager);
    __cxa_throw(this_00,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  return (bool)(bVar7 ^ 1);
}

Assistant:

bool XMLURL::conglomerateWithBase(const XMLURL& baseURL, bool useExceptions)
{
    // The base URL cannot be relative
    if (baseURL.isRelative())
    {
        if (useExceptions)
			ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_RelativeBaseURL, fMemoryManager);
        else
            return false;
    }

    //
    //  Check a special case. If all we have is a fragment, then we want
    //  to just take the base host and path, plus our fragment.
    //
    if ((fProtocol == Unknown)
    &&  !fHost
    &&  !fPath
    &&  fFragment)
    {
        // Just in case, make sure we don't leak the user or password values
        fMemoryManager->deallocate(fUser);//delete [] fUser;
        fUser = 0;
        fMemoryManager->deallocate(fPassword);//delete [] fPassword;
        fPassword = 0;

        // Copy over the protocol and port number as is
        fProtocol = baseURL.fProtocol;
        fPortNum = baseURL.fPortNum;

        // Replicate the base fields that are provided
        fHost = XMLString::replicate(baseURL.fHost, fMemoryManager);
        fUser = XMLString::replicate(baseURL.fUser, fMemoryManager);
        fPassword = XMLString::replicate(baseURL.fPassword, fMemoryManager);
        fPath = XMLString::replicate(baseURL.fPath, fMemoryManager);
        return true;
    }

    //
    //  All we have to do is run up through our fields and, for each one
    //  that we don't have, use the based URL's. Once we hit one field
    //  that we have, we stop.
    //
    if (fProtocol != Unknown)
        return true;
    fProtocol = baseURL.fProtocol;

    //
    //  If the protocol is not file, and we either already have our own
    //  host, or the base does not have one, then we are done.
    //
    if (fProtocol != File)
    {
        if (fHost || !baseURL.fHost)
            return true;
    }

    // Replicate all of the hosty stuff if the base has one
    if (baseURL.fHost)
    {
        // Just in case, make sure we don't leak a user or password field
        fMemoryManager->deallocate(fUser);//delete [] fUser;
        fUser = 0;
        fMemoryManager->deallocate(fPassword);//delete [] fPassword;
        fPassword = 0;
        fMemoryManager->deallocate(fHost);//delete [] fHost;
        fHost = 0;

        fHost = XMLString::replicate(baseURL.fHost, fMemoryManager);
        fUser = XMLString::replicate(baseURL.fUser, fMemoryManager);
        fPassword = XMLString::replicate(baseURL.fPassword, fMemoryManager);

        fPortNum = baseURL.fPortNum;
    }

    // If we have a path and its absolute, then we are done
    const bool hadPath = (fPath != 0);
    if (hadPath)
    {
        if (*fPath == chForwardSlash)
            return true;
    }

    // Its a relative path, so weave them together.
    if (baseURL.fPath) {
        XMLCh* temp = XMLPlatformUtils::weavePaths(baseURL.fPath, fPath ,fMemoryManager);
        fMemoryManager->deallocate(fPath);//delete [] fPath;
        fPath = temp;
    }

    // If we had any original path, then we are done
    if (hadPath)
        return true;

    // We had no original path, so go on to deal with the query/fragment parts
    if (fQuery || !baseURL.fQuery)
        return true;
    fQuery = XMLString::replicate(baseURL.fQuery, fMemoryManager);

    if (fFragment || !baseURL.fFragment)
        return true;
    fFragment = XMLString::replicate(baseURL.fFragment, fMemoryManager);
	return true;
}